

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

int check_physical(CPUPPCState_conflict2 *env,mmu_ctx_t_conflict *ctx,target_ulong eaddr,int rw)

{
  powerpc_mmu_t pVar1;
  bool bVar2;
  int ret;
  int in_plb;
  int rw_local;
  target_ulong eaddr_local;
  mmu_ctx_t_conflict *ctx_local;
  CPUPPCState_conflict2 *env_local;
  
  ctx->raddr = eaddr;
  ctx->prot = 5;
  pVar1 = env->mmu_model;
  if (2 < pVar1 - POWERPC_MMU_SOFT_6xx) {
    if (pVar1 == POWERPC_MMU_SOFT_4xx_Z) {
      if ((env->msr >> 3 & 1) == 0) {
        return 0;
      }
      if ((((env->pb[1] <= env->pb[0]) || (eaddr < env->pb[0])) ||
          (bVar2 = true, env->pb[1] <= eaddr)) &&
         ((bVar2 = false, env->pb[2] < env->pb[3] && (bVar2 = false, env->pb[2] <= eaddr)))) {
        bVar2 = eaddr < env->pb[3];
      }
      if ((long)(int)(uint)bVar2 != (env->msr >> 2 & 1)) {
        if (rw != 1) {
          return 0;
        }
        return -2;
      }
      ctx->prot = ctx->prot | 2;
      return 0;
    }
    if ((pVar1 != POWERPC_MMU_REAL) && (pVar1 != POWERPC_MMU_BOOKE)) {
      abort();
    }
  }
  ctx->prot = ctx->prot | 2;
  return 0;
}

Assistant:

static inline int check_physical(CPUPPCState *env, mmu_ctx_t *ctx,
                                 target_ulong eaddr, int rw)
{
    int in_plb, ret;

    ctx->raddr = eaddr;
    ctx->prot = PAGE_READ | PAGE_EXEC;
    ret = 0;
    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_REAL:
    case POWERPC_MMU_BOOKE:
        ctx->prot |= PAGE_WRITE;
        break;

    case POWERPC_MMU_SOFT_4xx_Z:
        if (unlikely(msr_pe != 0)) {
            /*
             * 403 family add some particular protections, using
             * PBL/PBU registers for accesses with no translation.
             */
            in_plb =
                /* Check PLB validity */
                (env->pb[0] < env->pb[1] &&
                 /* and address in plb area */
                 eaddr >= env->pb[0] && eaddr < env->pb[1]) ||
                (env->pb[2] < env->pb[3] &&
                 eaddr >= env->pb[2] && eaddr < env->pb[3]) ? 1 : 0;
            if (in_plb ^ msr_px) {
                /* Access in protected area */
                if (rw == 1) {
                    /* Access is not allowed */
                    ret = -2;
                }
            } else {
                /* Read-write access is allowed */
                ctx->prot |= PAGE_WRITE;
            }
        }
        break;

    default:
        /* Caller's checks mean we should never get here for other models */
        abort();
        return -1;
    }

    return ret;
}